

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_2::WritableFileImpl::Append(WritableFileImpl *this,Slice *data)

{
  size_t sVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 *in_RDX;
  ulong __n;
  ulong uVar4;
  ulong uVar5;
  void *__src;
  long in_FS_OFFSET;
  pthread_mutex_t *local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = data->size_;
  __src = (void *)*in_RDX;
  uVar5 = in_RDX[1];
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(sVar1 + 0x30));
  if (iVar2 == 0) {
    if (uVar5 != 0) {
      do {
        uVar4 = *(ulong *)(sVar1 + 0x70) & 0x1fff;
        if (uVar4 == 0) {
          local_40 = (char *)operator_new__(0x2000);
          std::vector<char*,std::allocator<char*>>::emplace_back<char*>
                    ((vector<char*,std::allocator<char*>> *)(sVar1 + 0x58),&local_40);
          __n = 0x2000;
        }
        else {
          __n = 0x2000 - uVar4;
        }
        if (uVar5 <= __n) {
          __n = uVar5;
        }
        memcpy((void *)(uVar4 + *(long *)(*(long *)(sVar1 + 0x60) + -8)),__src,__n);
        __src = (void *)((long)__src + __n);
        *(long *)(sVar1 + 0x70) = *(long *)(sVar1 + 0x70) + __n;
        uVar5 = uVar5 - __n;
      } while (uVar5 != 0);
    }
    (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)(sVar1 + 0x30));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (Status)(char *)this;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    uVar3 = std::__throw_system_error(iVar2);
    pthread_mutex_unlock(local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(uVar3);
    }
  }
  __stack_chk_fail();
}

Assistant:

Status Append(const Slice& data) override { return file_->Append(data); }